

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex.hpp
# Opt level: O0

void __thiscall
soplex::
SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::printStatus(SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *this,ostream *os,Status stat)

{
  undefined4 in_EDX;
  ostream *in_RSI;
  
  std::operator<<(in_RSI,"SoPlex status       : ");
  switch(in_EDX) {
  case 1:
    std::operator<<(in_RSI,"problem is solved [optimal]");
    break;
  case 2:
    std::operator<<(in_RSI,"problem is solved [unbounded]");
    break;
  case 3:
    std::operator<<(in_RSI,"problem is solved [infeasible]");
    break;
  case 4:
    std::operator<<(in_RSI,"problem is solved [infeasible or unbounded]");
    break;
  case 5:
    std::operator<<(in_RSI,"problem is solved [optimal with unscaled violations]");
    break;
  case 0xfffffff1:
    std::operator<<(in_RSI,"error [unspecified]");
    break;
  case 0xfffffff2:
    std::operator<<(in_RSI,"error [no ratiotester loaded]");
    break;
  case 0xfffffff3:
    std::operator<<(in_RSI,"error [no pricer loaded]");
    break;
  case 0xfffffff4:
    std::operator<<(in_RSI,"error [no linear solver loaded]");
    break;
  case 0xfffffff5:
    std::operator<<(in_RSI,"error [not initialized]");
    break;
  default:
  case 0:
    std::operator<<(in_RSI,"unknown");
    break;
  case 0xfffffff8:
    std::operator<<(in_RSI,"solving aborted [cycling]");
    break;
  case 0xfffffff9:
    std::operator<<(in_RSI,"solving aborted [time limit reached]");
    break;
  case 0xfffffffa:
    std::operator<<(in_RSI,"solving aborted [iteration limit reached]");
    break;
  case 0xfffffffb:
    std::operator<<(in_RSI,"solving aborted [objective limit reached]");
    break;
  case 0xfffffffc:
    std::operator<<(in_RSI,"basis is singular");
    break;
  case 0xfffffffd:
    std::operator<<(in_RSI,"no problem loaded");
    break;
  case 0xfffffffe:
    std::operator<<(in_RSI,"basis is regular");
  }
  std::operator<<(in_RSI,"\n");
  return;
}

Assistant:

void SoPlexBase<R>::printStatus(std::ostream& os, typename SPxSolverBase<R>::Status stat)
{
   os << "SoPlex status       : ";

   switch(stat)
   {
   case SPxSolverBase<R>::ERROR:
      os << "error [unspecified]";
      break;

   case SPxSolverBase<R>::NO_RATIOTESTER:
      os << "error [no ratiotester loaded]";
      break;

   case SPxSolverBase<R>::NO_PRICER:
      os << "error [no pricer loaded]";
      break;

   case SPxSolverBase<R>::NO_SOLVER:
      os << "error [no linear solver loaded]";
      break;

   case SPxSolverBase<R>::NOT_INIT:
      os << "error [not initialized]";
      break;

   case SPxSolverBase<R>::ABORT_CYCLING:
      os << "solving aborted [cycling]";
      break;

   case SPxSolverBase<R>::ABORT_TIME:
      os << "solving aborted [time limit reached]";
      break;

   case SPxSolverBase<R>::ABORT_ITER:
      os << "solving aborted [iteration limit reached]";
      break;

   case SPxSolverBase<R>::ABORT_VALUE:
      os << "solving aborted [objective limit reached]";
      break;

   case SPxSolverBase<R>::NO_PROBLEM:
      os << "no problem loaded";
      break;

   case SPxSolverBase<R>::REGULAR:
      os << "basis is regular";
      break;

   case SPxSolverBase<R>::SINGULAR:
      os << "basis is singular";
      break;

   case SPxSolverBase<R>::OPTIMAL:
      os << "problem is solved [optimal]";
      break;

   case SPxSolverBase<R>::UNBOUNDED:
      os << "problem is solved [unbounded]";
      break;

   case SPxSolverBase<R>::INFEASIBLE:
      os << "problem is solved [infeasible]";
      break;

   case SPxSolverBase<R>::INForUNBD:
      os << "problem is solved [infeasible or unbounded]";
      break;

   case SPxSolverBase<R>::OPTIMAL_UNSCALED_VIOLATIONS:
      os << "problem is solved [optimal with unscaled violations]";
      break;

   default:
   case SPxSolverBase<R>::UNKNOWN:
      os << "unknown";
      break;
   }

   os << "\n";
}